

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O1

void helicsFederateProcessCommunications(HelicsFederate fed,HelicsTime period,HelicsError *err)

{
  Federate *this;
  milliseconds period_00;
  
  this = getFed(fed,err);
  if (this != (Federate *)0x0) {
    if (period <= -9223372036.854765) {
      period_00.__r = -0x8637bd05af6;
    }
    else if (9223372036.854765 <= period) {
      period_00.__r = 0x8637bd05af6;
    }
    else {
      period_00.__r =
           (long)(period * 1000000000.0 +
                 *(double *)(&DAT_004366c0 + (ulong)(0.0 <= period * 1000000000.0) * 8)) / 1000000;
    }
    helics::Federate::processCommunication(this,period_00);
  }
  return;
}

Assistant:

void helicsFederateProcessCommunications(HelicsFederate fed, HelicsTime period, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return;
    }
    try {
        fedObj->processCommunication(helics::Time(period).to_ms());
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}